

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O3

void Dar_ManStop(Dar_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  if (p->pPars->fVerbose != 0) {
    Dar_ManPrintStats(p);
  }
  pVVar1 = p->vCutNodes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  if (p->pMemCuts != (Aig_MmFixed_t *)0x0) {
    Aig_MmFixedStop(p->pMemCuts,0);
  }
  pVVar1 = p->vLeavesBest;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  free(p);
  return;
}

Assistant:

void Dar_ManStop( Dar_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Dar_ManPrintStats( p );
    if ( p->vCutNodes )
        Vec_PtrFree( p->vCutNodes );
    if ( p->pMemCuts )
        Aig_MmFixedStop( p->pMemCuts, 0 );
    if ( p->vLeavesBest ) 
        Vec_PtrFree( p->vLeavesBest );
    ABC_FREE( p );
}